

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::insertSpirvRequirement(TIntermediate *this,TSpirvRequirement *spirvReq)

{
  _Rb_tree_header *p_Var1;
  TPoolAllocator *pTVar2;
  TSpirvRequirement *pTVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  TSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> extension;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (this->spirvRequirement == (TSpirvRequirement *)0x0) {
    pTVar2 = GetThreadPoolAllocator();
    pTVar3 = (TSpirvRequirement *)TPoolAllocator::allocate(pTVar2,0x70);
    pTVar2 = GetThreadPoolAllocator();
    (pTVar3->extensions).
    super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar2;
    p_Var1 = &(pTVar3->extensions).
              super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (pTVar3->extensions).
    super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pTVar3->extensions).
    super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pTVar3->extensions).
    super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pTVar3->extensions).
    super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pTVar3->extensions).
    super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pTVar2 = GetThreadPoolAllocator();
    (pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
    _M_impl.super__Node_allocator.allocator = pTVar2;
    p_Var1 = &(pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>.
              _M_t._M_impl.super__Rb_tree_header;
    (pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pTVar3->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_node_count = 0;
    this->spirvRequirement = pTVar3;
  }
  p_Var4 = (spirvReq->extensions).
           super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(spirvReq->extensions).
            super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_58,p_Var4[1]._M_parent,
                          (long)&(p_Var4[1]._M_parent)->_M_color +
                          (long)&(p_Var4[1]._M_left)->_M_color);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
      ::
      _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                  *)this->spirvRequirement,&local_58);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  for (p_Var5 = (spirvReq->capabilities).
                super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(spirvReq->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
       _M_impl.super__Rb_tree_header; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)
      ) {
    local_58._M_dataplus.super_allocator_type.allocator._4_4_ =
         (undefined4)((ulong)local_58._M_dataplus.super_allocator_type.allocator >> 0x20);
    local_58._M_dataplus.super_allocator_type.allocator._0_4_ = p_Var5[1]._M_color;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,glslang::pool_allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,glslang::pool_allocator<int>> *)
               &this->spirvRequirement->capabilities,(int *)&local_58);
  }
  return;
}

Assistant:

void TIntermediate::insertSpirvRequirement(const TSpirvRequirement* spirvReq)
{
    if (!spirvRequirement)
        spirvRequirement = new TSpirvRequirement;

    for (auto extension : spirvReq->extensions)
        spirvRequirement->extensions.insert(extension);

    for (auto capability : spirvReq->capabilities)
        spirvRequirement->capabilities.insert(capability);
}